

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ts_parser_delete(TSParser *self)

{
  ReduceAction *__ptr;
  TSRange *__ptr_00;
  _func_void_void_ptr *p_Var1;
  
  ts_stack_delete(self->stack);
  __ptr = (self->reduce_actions).contents;
  if (__ptr != (ReduceAction *)0x0) {
    free(__ptr);
    (self->reduce_actions).contents = (ReduceAction *)0x0;
    (self->reduce_actions).size = 0;
    (self->reduce_actions).capacity = 0;
  }
  __ptr_00 = (self->included_range_differences).contents;
  if (__ptr_00 != (TSRange *)0x0) {
    free(__ptr_00);
    (self->included_range_differences).contents = (TSRange *)0x0;
    (self->included_range_differences).size = 0;
    (self->included_range_differences).capacity = 0;
  }
  if ((self->old_tree).ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release(&self->tree_pool,self->old_tree);
    (self->old_tree).ptr = (SubtreeHeapData *)0x0;
  }
  free((self->lexer).included_ranges);
  ts_parser__set_cached_token(self,0,(Subtree)0x0,(Subtree)0x0);
  ts_subtree_pool_delete(&self->tree_pool);
  free((self->reusable_node).stack.contents);
  (self->reusable_node).stack.contents = (StackEntry *)0x0;
  (self->reusable_node).stack.size = 0;
  (self->reusable_node).stack.capacity = 0;
  if ((self->external_scanner_payload != (void *)0x0) &&
     (p_Var1 = (self->language->external_scanner).destroy, p_Var1 != (_func_void_void_ptr *)0x0)) {
    (*p_Var1)(self->external_scanner_payload);
  }
  free(self);
  return;
}

Assistant:

void ts_parser_delete(TSParser *self) {
  ts_stack_delete(self->stack);
  if (self->reduce_actions.contents) {
    array_delete(&self->reduce_actions);
  }
  if (self->included_range_differences.contents) {
    array_delete(&self->included_range_differences);
  }
  if (self->old_tree.ptr) {
    ts_subtree_release(&self->tree_pool, self->old_tree);
    self->old_tree = NULL_SUBTREE;
  }
  ts_lexer_delete(&self->lexer);
  ts_parser__set_cached_token(self, 0, NULL_SUBTREE, NULL_SUBTREE);
  ts_subtree_pool_delete(&self->tree_pool);
  reusable_node_delete(&self->reusable_node);
  ts_parser_set_language(self, NULL);
  ts_free(self);
}